

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

void __thiscall rw::Light::destroy(Light *this)

{
  LLLink *pLVar1;
  
  PluginList::destruct((PluginList *)&s_plglist,this);
  if ((this->object).object.parent != (void *)0x0) {
    pLVar1 = (this->object).inFrame.prev;
    pLVar1->next = (this->object).inFrame.next;
    ((this->object).inFrame.next)->prev = pLVar1;
  }
  (this->object).object.parent = (void *)0x0;
  (*DAT_00149da0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Light::destroy(void)
{
	s_plglist.destruct(this);
	assert(this->clump == nil);
	assert(this->world == nil);
	this->setFrame(nil);
	rwFree(this);
	numAllocated--;
}